

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxgeometsc.hpp
# Opt level: O0

number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* soplex::
  computeScalingVec<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *vecset,vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     *coScaleval,
            vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            *scaleval,
            number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *epsilon)

{
  bool bVar1;
  type_conflict5 tVar2;
  int iVar3;
  char *pcVar4;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *in_RCX;
  int __c;
  cpp_dec_float<200U,_int,_void> *in_RDX;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_RDI;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  p;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  int j;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  mini;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxi;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *vec;
  int i;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pmax;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  undefined4 in_stack_fffffffffffff7c8;
  int in_stack_fffffffffffff7cc;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffff7d0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff7d8;
  uint in_stack_fffffffffffff7e0;
  undefined4 in_stack_fffffffffffff7e4;
  uint uVar5;
  undefined1 local_800 [128];
  undefined1 local_780 [72];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff8c8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff8d0;
  double in_stack_fffffffffffff8e0;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffff8e8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_700;
  undefined8 local_680;
  undefined1 local_678 [128];
  undefined8 local_5f8;
  undefined8 local_5f0;
  undefined8 local_5e8;
  undefined1 local_5dc [128];
  undefined1 local_55c [128];
  undefined1 local_4dc [128];
  undefined1 local_45c [128];
  undefined1 local_3dc [128];
  uint local_35c;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_358;
  undefined8 local_2d8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2d0;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_250;
  uint local_244;
  undefined8 local_240 [2];
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *local_230;
  cpp_dec_float<200U,_int,_void> *local_228;
  undefined8 local_210;
  undefined8 *local_208;
  undefined8 local_1f8;
  undefined8 *local_1f0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1e8;
  undefined8 local_1e0;
  undefined8 local_1d8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_198;
  undefined1 *local_190;
  reference local_188;
  undefined1 *local_180;
  undefined1 *local_170;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_168;
  undefined1 *local_160;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 *local_140;
  undefined8 *local_138;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_129;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_128;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_108;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_100;
  undefined1 *local_f8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_e9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c0;
  undefined1 *local_b8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_a9;
  const_reference local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  const_reference local_88;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_80;
  undefined1 *local_78;
  undefined8 *local_70;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_68;
  undefined8 *local_60;
  undefined8 *local_58;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_50;
  undefined8 *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  undefined8 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  local_240[0] = 0;
  local_208 = local_240;
  local_210 = 0;
  local_230 = in_RCX;
  local_228 = in_RDX;
  local_138 = local_208;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<200U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
             (double)in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0);
  local_244 = 0;
  while (uVar5 = local_244,
        iVar3 = SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::num((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x170de1), (int)uVar5 < iVar3) {
    local_250 = SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_fffffffffffff7d0,in_stack_fffffffffffff7cc);
    local_2d8 = 0;
    local_1e8 = &local_2d0;
    local_1f0 = &local_2d8;
    local_1f8 = 0;
    local_140 = local_1f0;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              ((cpp_dec_float<200U,_int,_void> *)CONCAT44(uVar5,in_stack_fffffffffffff7e0),
               (double)in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0);
    local_1d8 = infinity();
    local_1d0 = &local_358;
    local_1e0 = 0;
    local_148 = local_1d8;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              ((cpp_dec_float<200U,_int,_void> *)CONCAT44(uVar5,in_stack_fffffffffffff7e0),
               (double)in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0);
    local_35c = 0;
    while (in_stack_fffffffffffff7e0 = local_35c,
          iVar3 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::size(local_250), (int)in_stack_fffffffffffff7e0 < iVar3) {
      in_stack_fffffffffffff7d8 =
           SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ::value(local_250,local_35c);
      in_stack_fffffffffffff7d0 = local_228;
      pcVar4 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::index(local_250,(char *)(ulong)local_35c,__c);
      local_a8 = std::
                 vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               *)in_stack_fffffffffffff7d0,(ulong)pcVar4 & 0xffffffff);
      local_98 = local_45c;
      local_a0 = in_stack_fffffffffffff7d8;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_a9,in_stack_fffffffffffff7d8,local_a8);
      local_90 = local_45c;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffff7d0);
      local_78 = local_45c;
      local_80 = local_a0;
      local_88 = local_a8;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (in_stack_fffffffffffff7d0,
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8),
                 (cpp_dec_float<200U,_int,_void> *)0x170feb);
      spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
      local_1a8 = local_4dc;
      local_1b0 = local_3dc;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffff7d0,
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
      local_198 = local_55c;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffff7d0,
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
      bVar1 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
      if (!bVar1) {
        tVar2 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8),
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x171099);
        if (tVar2) {
          local_158 = &local_2d0;
          local_160 = local_3dc;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                    (in_stack_fffffffffffff7d0,
                     (cpp_dec_float<200U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
        }
        tVar2 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8),
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x1710e9);
        if (tVar2) {
          local_168 = &local_358;
          local_170 = local_3dc;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                    (in_stack_fffffffffffff7d0,
                     (cpp_dec_float<200U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
        }
      }
      local_35c = local_35c + 1;
    }
    local_1c0 = infinity();
    local_1b8 = local_5dc;
    local_1c8 = 0;
    local_150 = local_1c0;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              ((cpp_dec_float<200U,_int,_void> *)CONCAT44(uVar5,in_stack_fffffffffffff7e0),
               (double)in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0);
    bVar1 = boost::multiprecision::operator==
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8),
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x1711a9);
    in_stack_fffffffffffff7cc = CONCAT13(1,(int3)in_stack_fffffffffffff7cc);
    if (!bVar1) {
      local_5e8 = 0;
      tVar2 = boost::multiprecision::operator==
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8),
                         (double *)0x1711d7);
      in_stack_fffffffffffff7cc = CONCAT13(tVar2,(int3)in_stack_fffffffffffff7cc);
    }
    if ((char)((uint)in_stack_fffffffffffff7cc >> 0x18) != '\0') {
      local_5f0 = 0x3ff0000000000000;
      local_50 = &local_358;
      local_58 = &local_5f0;
      local_48 = local_58;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                (in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0);
      local_5f8 = 0x3ff0000000000000;
      local_68 = &local_2d0;
      local_70 = &local_5f8;
      local_60 = local_70;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                (in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0);
    }
    local_680 = 0x3ff0000000000000;
    local_d8 = local_780;
    local_e0 = &local_358;
    local_e8 = &local_2d0;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_e9,local_e0,local_e8);
    local_d0 = local_780;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffff7d0);
    local_b8 = local_780;
    local_c0 = local_e0;
    local_c8 = local_e8;
    boost::multiprecision::default_ops::
    eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (in_stack_fffffffffffff7d0,
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8),
               (cpp_dec_float<200U,_int,_void> *)0x171364);
    spxSqrt<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
    local_28 = local_678;
    local_30 = &local_680;
    local_38 = &local_700;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_39,local_38);
    local_20 = local_678;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffff7d0);
    local_10 = local_678;
    local_8 = local_30;
    local_18 = local_38;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (in_stack_fffffffffffff7d0,
               (double *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8),
               (cpp_dec_float<200U,_int,_void> *)0x171428);
    local_188 = std::
                vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ::operator[](local_230,(ulong)local_244);
    local_190 = local_678;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (in_stack_fffffffffffff7d0,
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
    local_118 = local_800;
    local_120 = &local_2d0;
    local_128 = &local_358;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_129,local_120,local_128);
    local_110 = local_800;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffff7d0);
    local_f8 = local_800;
    local_100 = local_120;
    local_108 = local_128;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (in_stack_fffffffffffff7d0,
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8),
               (cpp_dec_float<200U,_int,_void> *)0x171519);
    tVar2 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8),
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x171528);
    if (tVar2) {
      local_180 = local_800;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                (in_stack_fffffffffffff7d0,
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
    }
    local_244 = local_244 + 1;
  }
  return in_RDI;
}

Assistant:

static R computeScalingVec(
   const SVSetBase<R>*   vecset, const std::vector<R>& coScaleval,
   std::vector<R>&       scaleval, R epsilon)
{
   R pmax = 0.0;

   assert(scaleval.size() == unsigned(vecset->num()));

   for(int i = 0; i < vecset->num(); ++i)
   {
      const SVectorBase<R>& vec = (*vecset)[i];

      R maxi = 0.0;
      R mini = R(infinity);

      for(int j = 0; j < vec.size(); ++j)
      {
         const R x = spxAbs(vec.value(j) * coScaleval[unsigned(vec.index(j))]);

         if(!isZero(x, epsilon))
         {
            if(x > maxi)
               maxi = x;

            if(x < mini)
               mini = x;
         }
      }

      // empty rows/cols are possible
      if(mini == R(infinity) || maxi == 0.0)
      {
         mini = 1.0;
         maxi = 1.0;
      }

      assert(mini < R(infinity));
      assert(maxi > 0.0);

      scaleval[unsigned(i)] = 1.0 / spxSqrt(mini * maxi);

      const R p = maxi / mini;

      if(p > pmax)
         pmax = p;
   }

   return pmax;
}